

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O0

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::generate(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *base)

{
  bool bVar1;
  type_conflict5 tVar2;
  Representation RVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  DataKey *pDVar7;
  char *pcVar8;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  element_type *peVar9;
  SPxId base_00;
  int __c;
  int __c_00;
  int __c_01;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  long *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  feastol;
  int k_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  int nRowEntries;
  int k;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int minRowEntries;
  int idx;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxEntry;
  int dim;
  int sel;
  int j;
  int stepi;
  int i;
  DataArray<soplex::SPxId> pref;
  Desc desc;
  SPxId tmpId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffff708;
  int in_stack_fffffffffffff70c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff710;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff718;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff720;
  DataKey in_stack_fffffffffffff728;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff730;
  SPxId *in_stack_fffffffffffff740;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *id;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff748;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff750;
  type_conflict5 local_88a;
  type_conflict5 local_879;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff848;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff850;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff858;
  DataArray<soplex::SPxId> *in_stack_fffffffffffff860;
  undefined1 local_738 [96];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff928;
  undefined1 local_6b8 [128];
  Real local_638;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_62c;
  int local_5ac;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5a8;
  Real local_528;
  undefined1 local_520 [128];
  undefined1 local_4a0 [256];
  int local_3a0;
  int local_39c;
  undefined1 local_398 [64];
  SPxId *in_stack_fffffffffffffca8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcb0;
  Desc *in_stack_fffffffffffffcb8;
  SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcc0;
  int local_318;
  undefined1 local_314 [128];
  int local_294;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_290;
  undefined4 local_284;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_280;
  int local_200;
  int local_1fc;
  uint local_1f8;
  int local_1f4;
  int local_1f0;
  DataArray<soplex::SPxId> local_1e0;
  undefined1 local_1c8 [64];
  DataKey local_188;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_180;
  undefined8 local_170;
  Real *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  undefined8 local_158;
  undefined4 *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined4 *local_100;
  Real *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  Real *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  Real *local_8;
  
  local_180 = in_RSI;
  SPxId::SPxId((SPxId *)0x759d54);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x759d75);
  DataArray<int>::reSize((DataArray<int> *)in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x759da5);
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reSize((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x759dd5);
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reSize((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x759e05);
  DataArray<bool>::reSize((DataArray<bool> *)in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x759e37);
  DataArray<bool>::reSize((DataArray<bool> *)in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
  RVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rep(local_180);
  if (RVar3 == COLUMN) {
    in_RDI[7] = (long)(in_RDI + 0xc);
    in_RDI[8] = (long)(in_RDI + 9);
  }
  else {
    in_RDI[7] = (long)(in_RDI + 9);
    in_RDI[8] = (long)(in_RDI + 0xc);
  }
  (**(code **)(*in_RDI + 0x40))(in_RDI,local_180);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Desc::Desc((Desc *)in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x759ed1);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x759ee7);
  DataArray<soplex::SPxId>::DataArray
            ((DataArray<soplex::SPxId> *)in_stack_fffffffffffff720,
             (int)((ulong)in_stack_fffffffffffff718 >> 0x20),(int)in_stack_fffffffffffff718,
             (Real)in_stack_fffffffffffff710);
  initPrefs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
             in_stack_fffffffffffff848);
  for (local_1f0 = 0; iVar5 = local_1f0,
      iVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x759f69), iVar5 < iVar4; local_1f0 = local_1f0 + 1) {
    piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_1f0);
    *piVar6 = 0;
  }
  RVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rep(local_180);
  if (RVar3 == COLUMN) {
    local_1f0 = 0;
    local_1f4 = 1;
  }
  else {
    local_1f0 = DataArray<soplex::SPxId>::size(&local_1e0);
    local_1f0 = local_1f0 + -1;
    local_1f4 = -1;
  }
  local_200 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x75a04d);
  local_284 = 0;
  local_148 = &local_280;
  local_150 = &local_284;
  local_158 = 0;
  local_100 = local_150;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (in_stack_fffffffffffff720,(longlong)in_stack_fffffffffffff718,in_stack_fffffffffffff710
            );
  do {
    iVar5 = local_1f0;
    bVar1 = false;
    if (-1 < local_1f0) {
      iVar4 = DataArray<soplex::SPxId>::size(&local_1e0);
      bVar1 = iVar5 < iVar4;
    }
    if (!bVar1) goto LAB_0075ad6d;
    pDVar7 = &DataArray<soplex::SPxId>::operator[](&local_1e0,local_1f0)->super_DataKey;
    local_188 = *pDVar7;
    local_290 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::vector(in_stack_fffffffffffff730,(SPxId *)in_stack_fffffffffffff728);
    local_1fc = -1;
    iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size(local_290);
    if (iVar5 == 1) {
      pcVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_290,(char *)0x0,__c);
      local_294 = (int)pcVar8;
      piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_294);
      if (*piVar6 < 2) {
        local_1fc = local_294;
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_294);
        local_200 = (uint)(0 < *piVar6) + local_200;
      }
    }
    else {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::maxAbs(in_stack_fffffffffffff928);
      local_108 = &local_280;
      local_110 = local_314;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
      local_318 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x75a25f);
      local_1f8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_290);
      while (local_1f8 = local_1f8 - 1, -1 < (int)local_1f8) {
        local_140 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::value(local_290,local_1f8);
        local_138 = local_398;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
        pcVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::index(local_290,(char *)(ulong)local_1f8,__c_00);
        local_39c = (int)pcVar8;
        this_00 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::coVector(in_stack_fffffffffffff710,in_stack_fffffffffffff70c);
        local_3a0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(this_00);
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_39c);
        bVar1 = false;
        if (*piVar6 == 0) {
          local_128 = local_4a0;
          local_130 = local_398;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
          spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
          (**(code **)(*in_RDI + 0x30))();
          peVar9 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x75a3db);
          local_528 = Tolerances::scaleAccordingToEpsilon(peVar9,0.001);
          local_30 = &local_528;
          local_38 = &local_280;
          local_28 = local_520;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_39,local_38);
          local_20 = local_520;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710);
          local_18 = local_38;
          local_8 = local_30;
          local_10 = local_520;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                     (double *)0x75a4ab);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x75a4c4);
          bVar1 = false;
          if (tVar2) {
            bVar1 = local_3a0 < local_318;
          }
        }
        if (bVar1) {
          local_318 = local_3a0;
          local_1fc = local_39c;
        }
      }
    }
    if (local_1fc < 0) {
      RVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rep(local_180);
      if (RVar3 == COLUMN) {
        in_stack_fffffffffffff718 = local_180;
        DataArray<soplex::SPxId>::operator[](&local_1e0,local_1f0);
        setPrimalStatus(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                        in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      }
      else {
        in_stack_fffffffffffff710 = local_180;
        DataArray<soplex::SPxId>::operator[](&local_1e0,local_1f0);
        setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((Desc *)in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                   in_stack_fffffffffffff740);
      }
    }
    else {
      piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_1fc);
      *piVar6 = 2;
      RVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rep(local_180);
      if (RVar3 == COLUMN) {
        DataArray<soplex::SPxId>::operator[](&local_1e0,local_1f0);
        setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((Desc *)in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                   in_stack_fffffffffffff740);
      }
      else {
        DataArray<soplex::SPxId>::operator[](&local_1e0,local_1f0);
        setPrimalStatus(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                        in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      }
      local_1f8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_290);
      while (local_1f8 = local_1f8 - 1, -1 < (int)local_1f8) {
        local_120 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::value(local_290,local_1f8);
        local_118 = &local_5a8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
        pcVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::index(local_290,(char *)(ulong)local_1f8,__c_01);
        local_5ac = (int)pcVar8;
        (**(code **)(*in_RDI + 0x30))();
        peVar9 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x75a6a4);
        local_638 = Tolerances::floatingPointFeastol(peVar9);
        local_160 = &local_62c;
        local_168 = &local_638;
        local_170 = 0;
        local_f8 = local_168;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffff720,(double)in_stack_fffffffffffff718,
                   in_stack_fffffffffffff710);
        piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_5ac);
        local_879 = false;
        if (*piVar6 == 0) {
          local_a0 = &local_62c;
          local_a8 = &local_280;
          local_98 = local_6b8;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_a9,local_a0,local_a8);
          local_90 = local_6b8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710);
          local_80 = local_a0;
          local_88 = local_a8;
          local_78 = local_6b8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                     (cpp_dec_float<200U,_int,_void> *)0x75a806);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x75a81f);
          local_88a = true;
          if (!tVar2) {
            local_68 = &local_5a8;
            local_60 = local_738;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_69,local_68);
            local_58 = local_68;
            local_50 = local_738;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708));
            local_48 = local_738;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710);
            local_e0 = &local_62c;
            local_e8 = &local_280;
            local_d8 = &stack0xfffffffffffff848;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_e9,local_e0,local_e8);
            local_d0 = &stack0xfffffffffffff848;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710);
            local_c0 = local_e0;
            local_c8 = local_e8;
            local_b8 = &stack0xfffffffffffff848;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff710,
                       (cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                       (cpp_dec_float<200U,_int,_void> *)0x75a97a);
            local_88a = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x75a993);
          }
          local_879 = local_88a;
        }
        if (local_879 != false) {
          piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_5ac);
          *piVar6 = 1;
          local_200 = local_200 + -1;
        }
      }
      local_200 = local_200 + -1;
      if (local_200 == 0) {
        RVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rep(local_180);
        if (RVar3 == COLUMN) {
          local_1f0 = local_1f4 + local_1f0;
          while( true ) {
            iVar5 = local_1f0;
            bVar1 = false;
            if (-1 < local_1f0) {
              iVar4 = DataArray<soplex::SPxId>::size(&local_1e0);
              bVar1 = iVar5 < iVar4;
            }
            if (!bVar1) break;
            in_stack_fffffffffffff750 = local_180;
            DataArray<soplex::SPxId>::operator[](&local_1e0,local_1f0);
            setPrimalStatus(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                            in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
            local_1f0 = local_1f4 + local_1f0;
          }
          local_1f0 = DataArray<int>::size((DataArray<int> *)(in_RDI + 4));
          while (local_1f0 = local_1f0 + -1, -1 < local_1f0) {
            piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_1f0);
            if (*piVar6 < 2) {
              id = local_180;
              base_00 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::coId(in_stack_fffffffffffff728,
                               (int)((ulong)in_stack_fffffffffffff720 >> 0x20));
              setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((Desc *)in_stack_fffffffffffff750,
                         (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)base_00.super_DataKey,(SPxId *)id);
            }
          }
        }
        else {
          local_1f0 = local_1f4 + local_1f0;
          while( true ) {
            iVar5 = local_1f0;
            bVar1 = false;
            if (-1 < local_1f0) {
              iVar4 = DataArray<soplex::SPxId>::size(&local_1e0);
              bVar1 = iVar5 < iVar4;
            }
            if (!bVar1) break;
            DataArray<soplex::SPxId>::operator[](&local_1e0,local_1f0);
            setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((Desc *)in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                       in_stack_fffffffffffff740);
            local_1f0 = local_1f4 + local_1f0;
          }
          local_1f0 = DataArray<int>::size((DataArray<int> *)(in_RDI + 4));
          while (local_1f0 = local_1f0 + -1, -1 < local_1f0) {
            piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_1f0);
            if (*piVar6 < 2) {
              in_stack_fffffffffffff728 =
                   (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_fffffffffffff728,(int)((ulong)local_180 >> 0x20));
              setPrimalStatus(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                              in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
            }
          }
        }
LAB_0075ad6d:
        (*(local_180->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x58])(local_180,local_1c8);
        DataArray<soplex::SPxId>::~DataArray((DataArray<soplex::SPxId> *)in_stack_fffffffffffff710);
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Desc::~Desc((Desc *)in_stack_fffffffffffff710);
        return;
      }
    }
    local_1f0 = local_1f4 + local_1f0;
  } while( true );
}

Assistant:

void SPxWeightST<R>::generate(SPxSolverBase<R>& base)
{
   SPxId tmpId;

   forbidden.reSize(base.dim());
   rowWeight.reSize(base.nRows());
   colWeight.reSize(base.nCols());
   rowRight.reSize(base.nRows());
   colUp.reSize(base.nCols());

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      weight   = &colWeight;
      coWeight = &rowWeight;
   }
   else
   {
      weight   = &rowWeight;
      coWeight = &colWeight;
   }

   assert(weight->size()   == base.coDim());
   assert(coWeight->size() == base.dim());

   setupWeights(base);

   typename SPxBasisBase<R>::Desc desc(base);
   //   desc.reSize(base.nRows(), base.nCols());

   DataArray < SPxId > pref(base.nRows() + base.nCols());
   initPrefs(pref, base, rowWeight, colWeight);

   int i;
   int stepi;
   int j;
   int sel;

   for(i = 0; i < base.dim(); ++i)
      forbidden[i] = 0;

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      // in COLUMN rep we scan from beginning to end
      i      = 0;
      stepi = 1;
   }
   else
   {
      // in ROW rep we scan from end to beginning
      i      = pref.size() - 1;
      stepi = -1;
   }

   int  dim = base.dim();
   R maxEntry = 0;

   for(; i >= 0 && i < pref.size(); i += stepi)
   {
      tmpId              = pref[i];
      const SVectorBase<R>& vec = base.vector(tmpId);
      sel                = -1;

      // column or row singleton ?
      if(vec.size() == 1)
      {
         int idx = vec.index(0);

         if(forbidden[idx] < 2)
         {
            sel  = idx;
            dim += (forbidden[idx] > 0) ? 1 : 0;
         }
      }
      else
      {
         maxEntry = vec.maxAbs();

         // initialize the nonzero counter
         int minRowEntries = base.nRows();

         // find a stable index with a sparse row/column
         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            int  nRowEntries = base.coVector(k).size();

            if(!forbidden[k]
                  && (spxAbs(x) > this->tolerances()->scaleAccordingToEpsilon(SOPLEX_STABLE) * maxEntry)
                  && (nRowEntries < minRowEntries))
            {
               minRowEntries = nRowEntries;
               sel  = k;
            }
         }
      }

      // we found a valid index
      if(sel >= 0)
      {
         SPX_DEBUG(

            if(pref[i].type() == SPxId::ROW_ID)
            std::cout << "DWEIST01 r" << base.number(pref[i]);
            else
               std::cout << "DWEIST02 c" << base.number(pref[i]);
            )

               forbidden[sel] = 2;

         // put current column/row into basis
         if(base.rep() == SPxSolverBase<R>::COLUMN)
            setDualStatus(desc, base, pref[i]);
         else
            setPrimalStatus(desc, base, pref[i]);

         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            R feastol = this->tolerances()->floatingPointFeastol();

            if(!forbidden[k] && (x > feastol * maxEntry || -x > feastol * maxEntry))
            {
               forbidden[k] = 1;
               --dim;
            }
         }

         if(--dim == 0)
         {
            //@ for(++i; i < pref.size(); ++i)
            if(base.rep() == SPxSolverBase<R>::COLUMN)
            {
               // set all remaining indeces to nonbasic status
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setPrimalStatus(desc, base, pref[i]);

               // fill up the basis wherever linear independence is assured
               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setDualStatus(desc, base, base.coId(i));
               }
            }
            else
            {
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setDualStatus(desc, base, pref[i]);

               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setPrimalStatus(desc, base, base.coId(i));
               }
            }

            break;
         }
      }
      // sel == -1
      else if(base.rep() == SPxSolverBase<R>::COLUMN)
         setPrimalStatus(desc, base, pref[i]);
      else
         setDualStatus(desc, base, pref[i]);

#ifndef NDEBUG
      {
         int n, m;

         for(n = 0, m = forbidden.size(); n < forbidden.size(); ++n)
            m -= (forbidden[n] != 0) ? 1 : 0;

         assert(m == dim);
      }
#endif  // NDEBUG
   }

   assert(dim == 0);

   base.loadBasis(desc);
#ifdef  TEST
   base.init();

   int changed = 0;
   const VectorBase<R>& pvec = base.pVec();

   for(i = pvec.dim() - 1; i >= 0; --i)
   {
      if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_UPPER
            && base.lower(i) > R(-infinity) && pvec[i] > base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
              && base.upper(i) < R(infinity) && pvec[i] < base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
   }

   if(changed)
   {
      std::cout << "changed basis\n";
      base.loadBasis(desc);
   }
   else
      std::cout << "nothing changed\n";

#endif  // TEST
}